

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cc
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<double> __l;
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_11;
  ostringstream error_message_10;
  vector<double,_std::allocator<double>_> average_entropy;
  ostringstream error_message_9;
  int num_data;
  ostringstream error_message_8;
  ostringstream error_message_7;
  ostringstream error_message_6;
  double entropy;
  vector<double,_std::allocator<double>_> probability;
  ostringstream error_message_5;
  EntropyCalculation entropy_calculation;
  Buffer buffer;
  StatisticsAccumulation statistics_accumulation;
  istream *input_stream;
  ostringstream error_message_4;
  ifstream ifs;
  ostringstream error_message_3;
  char *input_file;
  ostringstream error_message_2;
  int num_input_files;
  ostringstream error_message_1;
  int tmp;
  int max;
  int min;
  ostringstream error_message;
  int option_char;
  bool output_frame_by_frame;
  EntropyUnits entropy_unit;
  int num_element;
  option *in_stack_ffffffffffffe738;
  double data_to_write;
  Buffer *in_stack_ffffffffffffe740;
  string *in_stack_ffffffffffffe748;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffe750;
  int in_stack_ffffffffffffe754;
  size_type in_stack_ffffffffffffe758;
  undefined7 in_stack_ffffffffffffe760;
  undefined1 in_stack_ffffffffffffe767;
  allocator_type *in_stack_ffffffffffffe768;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe770;
  undefined7 in_stack_ffffffffffffe778;
  undefined1 in_stack_ffffffffffffe77f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe780;
  int in_stack_ffffffffffffe788;
  undefined2 in_stack_ffffffffffffe78c;
  byte in_stack_ffffffffffffe78e;
  undefined1 in_stack_ffffffffffffe78f;
  Buffer *in_stack_ffffffffffffe790;
  StatisticsAccumulation *in_stack_ffffffffffffe798;
  undefined7 in_stack_ffffffffffffe7a0;
  undefined1 in_stack_ffffffffffffe7a7;
  char *local_1828;
  char *local_17e0;
  byte local_1792;
  bool local_176a;
  Buffer *in_stack_ffffffffffffe898;
  allocator *in_stack_ffffffffffffe8a0;
  StatisticsAccumulation *in_stack_ffffffffffffe8a8;
  allocator local_1749;
  string local_1748 [32];
  ostringstream local_1728 [80];
  ostringstream *in_stack_ffffffffffffe928;
  string *in_stack_ffffffffffffe930;
  allocator local_15a9;
  string local_15a8 [32];
  ostringstream local_1588 [415];
  allocator local_13e9;
  string local_13e8 [32];
  ostringstream local_13c8 [376];
  int local_1250;
  allocator local_1249;
  string local_1248 [32];
  ostringstream local_1228 [383];
  undefined1 local_10a9 [17];
  undefined8 local_1098;
  allocator local_1071;
  string local_1070 [32];
  ostringstream local_1050 [383];
  allocator local_ed1;
  string local_ed0 [32];
  ostringstream local_eb0 [423];
  allocator local_d09;
  string local_d08 [32];
  ostringstream local_ce8 [376];
  EntropyCalculation local_b70;
  Buffer local_b58;
  StatisticsAccumulation local_ad8;
  char *local_ac0;
  int local_ab8;
  allocator local_ab1;
  string local_ab0 [32];
  ostringstream local_a90 [376];
  char local_918 [527];
  allocator local_709;
  string local_708 [32];
  ostringstream local_6e8 [376];
  char *local_570;
  allocator local_561;
  string local_560 [32];
  ostringstream local_540 [376];
  int local_3c8;
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [32];
  EntropyUnits local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [32];
  int local_20;
  byte local_19;
  EntropyUnits local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x100;
  local_18 = kBit;
  local_19 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_20 = ya_getopt_long(in_stack_ffffffffffffe754,(char **)in_stack_ffffffffffffe748,
                                   (char *)in_stack_ffffffffffffe740,in_stack_ffffffffffffe738,
                                   (int *)0x103752), pcVar1 = ya_optarg, local_20 != -1) {
    in_stack_ffffffffffffe8a8 = (StatisticsAccumulation *)(ulong)(local_20 - 0x66);
    switch(in_stack_ffffffffffffe8a8) {
    case (StatisticsAccumulation *)0x0:
      local_19 = 1;
      break;
    default:
      anon_unknown.dwarf_1d75::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffe767,in_stack_ffffffffffffe760));
      return 1;
    case (StatisticsAccumulation *)0x2:
      anon_unknown.dwarf_1d75::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffe767,in_stack_ffffffffffffe760));
      return 0;
    case (StatisticsAccumulation *)0x6:
      in_stack_ffffffffffffe8a0 = &local_41;
      in_stack_ffffffffffffe898 = (Buffer *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_40,(char *)in_stack_ffffffffffffe898,in_stack_ffffffffffffe8a0);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe748,(int *)in_stack_ffffffffffffe740);
      local_176a = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_176a) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        std::operator<<((ostream *)local_1d0,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"entropy",&local_1f1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
      break;
    case (StatisticsAccumulation *)0x9:
      local_1f8 = 0;
      local_1fc = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar1,&local_221);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe748,(int *)in_stack_ffffffffffffe740);
      local_1792 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_200,0,2);
        local_1792 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if ((local_1792 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        poVar5 = std::operator<<((ostream *)local_3a0,
                                 "The argument for the -o option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"entropy",&local_3c1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
      local_18 = local_200;
    }
  }
  local_3c8 = local_8 - ya_optind;
  if (1 < local_3c8) {
    std::__cxx11::ostringstream::ostringstream(local_540);
    std::operator<<((ostream *)local_540,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_560,"entropy",&local_561);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
    std::__cxx11::string::~string(local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_540);
    return local_4;
  }
  if (local_3c8 == 0) {
    local_17e0 = (char *)0x0;
  }
  else {
    local_17e0 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_570 = local_17e0;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_6e8);
    std::operator<<((ostream *)local_6e8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_708,"entropy",&local_709);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
    std::__cxx11::string::~string(local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_6e8);
    return local_4;
  }
  std::ifstream::ifstream(local_918);
  pcVar1 = local_570;
  if (local_570 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_918,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_a90);
      poVar5 = std::operator<<((ostream *)local_a90,"Cannot open file ");
      std::operator<<(poVar5,local_570);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ab0,"entropy",&local_ab1);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
      std::__cxx11::string::~string(local_ab0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
      local_4 = 1;
      local_ab8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a90);
      goto LAB_00104e7e;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_1828 = (char *)&std::cin;
  }
  else {
    local_1828 = local_918;
  }
  local_ac0 = local_1828;
  sptk::StatisticsAccumulation::StatisticsAccumulation(&local_ad8,0,1,false,false);
  sptk::StatisticsAccumulation::Buffer::Buffer
            ((Buffer *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750));
  sptk::EntropyCalculation::EntropyCalculation(&local_b70,local_14,local_18);
  bVar2 = sptk::StatisticsAccumulation::IsValid(&local_ad8);
  if ((bVar2) && (bVar2 = sptk::EntropyCalculation::IsValid(&local_b70), bVar2)) {
    std::allocator<double>::allocator((allocator<double> *)0x1043f7);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffe767,in_stack_ffffffffffffe760),
               in_stack_ffffffffffffe758,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750));
    std::allocator<double>::~allocator((allocator<double> *)0x104423);
    do {
      while( true ) {
        data_to_write = 0.0;
        bVar2 = sptk::ReadStream<double>
                          (SUB81((ulong)in_stack_ffffffffffffe790 >> 0x30,0),
                           (int)in_stack_ffffffffffffe790,
                           CONCAT13(in_stack_ffffffffffffe78f,
                                    CONCAT12(in_stack_ffffffffffffe78e,in_stack_ffffffffffffe78c)),
                           in_stack_ffffffffffffe788,in_stack_ffffffffffffe780,
                           (istream *)CONCAT17(in_stack_ffffffffffffe77f,in_stack_ffffffffffffe778),
                           (int *)CONCAT17(in_stack_ffffffffffffe7a7,in_stack_ffffffffffffe7a0));
        if (!bVar2) {
          uVar4 = sptk::StatisticsAccumulation::GetNumData(&local_ad8,&local_b58,&local_1250);
          if (!(bool)uVar4) {
            std::__cxx11::ostringstream::ostringstream(local_13c8);
            std::operator<<((ostream *)local_13c8,"Failed to accumulate statistics");
            paVar6 = &local_13e9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_13e8,"entropy",paVar6);
            sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
            std::__cxx11::string::~string(local_13e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_13e9);
            local_4 = 1;
            local_ab8 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_13c8);
            goto LAB_00104e0e;
          }
          if (((local_19 & 1) == 0) && (0 < local_1250)) {
            std::allocator<double>::allocator((allocator<double> *)0x104ad2);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT17(in_stack_ffffffffffffe767,in_stack_ffffffffffffe760),
                       in_stack_ffffffffffffe758,
                       (allocator_type *)
                       CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750));
            std::allocator<double>::~allocator((allocator<double> *)0x104af8);
            bVar2 = sptk::StatisticsAccumulation::GetMean
                              (in_stack_ffffffffffffe798,in_stack_ffffffffffffe790,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT17(in_stack_ffffffffffffe78f,
                                        CONCAT16(in_stack_ffffffffffffe78e,
                                                 CONCAT24(in_stack_ffffffffffffe78c,
                                                          in_stack_ffffffffffffe788))));
            if (bVar2) {
              bVar2 = sptk::WriteStream<double>
                                ((int)in_stack_ffffffffffffe790,
                                 CONCAT13(in_stack_ffffffffffffe78f,
                                          CONCAT12(in_stack_ffffffffffffe78e,
                                                   in_stack_ffffffffffffe78c)),
                                 in_stack_ffffffffffffe780,
                                 (ostream *)CONCAT17(uVar4,in_stack_ffffffffffffe778),
                                 (int *)in_stack_ffffffffffffe770);
              in_stack_ffffffffffffe754 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffe754);
              if (bVar2) {
                local_ab8 = 0;
              }
              else {
                std::__cxx11::ostringstream::ostringstream(local_1728);
                std::operator<<((ostream *)local_1728,"Failed to write entropy");
                paVar6 = &local_1749;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1748,"entropy",paVar6);
                sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
                std::__cxx11::string::~string(local_1748);
                std::allocator<char>::~allocator((allocator<char> *)&local_1749);
                local_4 = 1;
                local_ab8 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_1728);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_1588);
              std::operator<<((ostream *)local_1588,"Failed to calculate entropy");
              paVar6 = &local_15a9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_15a8,"entropy",paVar6);
              sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
              std::__cxx11::string::~string(local_15a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_15a9);
              local_4 = 1;
              local_ab8 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_1588);
            }
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750));
            if (local_ab8 != 0) goto LAB_00104e0e;
          }
          local_4 = 0;
          local_ab8 = 1;
          goto LAB_00104e0e;
        }
        bVar2 = sptk::EntropyCalculation::Run
                          ((EntropyCalculation *)
                           CONCAT17(in_stack_ffffffffffffe78f,
                                    CONCAT16(in_stack_ffffffffffffe78e,
                                             CONCAT24(in_stack_ffffffffffffe78c,
                                                      in_stack_ffffffffffffe788))),
                           in_stack_ffffffffffffe780,
                           (double *)CONCAT17(in_stack_ffffffffffffe77f,in_stack_ffffffffffffe778));
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream(local_eb0);
          std::operator<<((ostream *)local_eb0,"Failed to calculate entropy");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_ed0,"entropy",&local_ed1);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
          std::__cxx11::string::~string(local_ed0);
          std::allocator<char>::~allocator((allocator<char> *)&local_ed1);
          local_4 = 1;
          local_ab8 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_eb0);
          goto LAB_00104e0e;
        }
        if ((local_19 & 1) == 0) break;
        in_stack_ffffffffffffe7a7 = sptk::WriteStream<double>(data_to_write,(ostream *)0x10460c);
        if (!(bool)in_stack_ffffffffffffe7a7) {
          std::__cxx11::ostringstream::ostringstream(local_1050);
          std::operator<<((ostream *)local_1050,"Failed to write entropy");
          paVar6 = (allocator *)(local_10a9 + 0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1070,"entropy",paVar6);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
          std::__cxx11::string::~string(local_1070);
          std::allocator<char>::~allocator((allocator<char> *)(local_10a9 + 0x38));
          local_4 = 1;
          local_ab8 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1050);
          goto LAB_00104e0e;
        }
      }
      local_10a9[1] = local_eb0[0x178];
      local_10a9[2] = local_eb0[0x179];
      local_10a9[3] = local_eb0[0x17a];
      local_10a9[4] = local_eb0[0x17b];
      local_10a9[5] = local_eb0[0x17c];
      local_10a9[6] = local_eb0[0x17d];
      local_10a9[7] = local_eb0[0x17e];
      local_10a9[8] = local_eb0[0x17f];
      local_10a9._9_8_ = local_10a9 + 1;
      local_1098 = 1;
      in_stack_ffffffffffffe790 = (Buffer *)local_10a9;
      std::allocator<double>::allocator((allocator<double> *)0x10477c);
      __l._M_array._7_1_ = in_stack_ffffffffffffe77f;
      __l._M_array._0_7_ = in_stack_ffffffffffffe778;
      __l._M_len = (size_type)in_stack_ffffffffffffe780;
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffe770,__l,in_stack_ffffffffffffe768);
      in_stack_ffffffffffffe78f =
           sptk::StatisticsAccumulation::Run
                     (in_stack_ffffffffffffe8a8,
                      (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe8a0,
                      in_stack_ffffffffffffe898);
      in_stack_ffffffffffffe78e = in_stack_ffffffffffffe78f ^ 0xff;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750));
      std::allocator<double>::~allocator((allocator<double> *)0x1047e7);
    } while ((in_stack_ffffffffffffe78e & 1) == 0);
    std::__cxx11::ostringstream::ostringstream(local_1228);
    std::operator<<((ostream *)local_1228,"Failed to accumulate statistics");
    paVar6 = &local_1249;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1248,"entropy",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
    std::__cxx11::string::~string(local_1248);
    std::allocator<char>::~allocator((allocator<char> *)&local_1249);
    local_4 = 1;
    local_ab8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1228);
LAB_00104e0e:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_ce8);
    std::operator<<((ostream *)local_ce8,"Failed to initialize EntropyCalculation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d08,"entropy",&local_d09);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
    std::__cxx11::string::~string(local_d08);
    std::allocator<char>::~allocator((allocator<char> *)&local_d09);
    local_4 = 1;
    local_ab8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_ce8);
  }
  sptk::EntropyCalculation::~EntropyCalculation(&local_b70);
  sptk::StatisticsAccumulation::Buffer::~Buffer(in_stack_ffffffffffffe740);
  sptk::StatisticsAccumulation::~StatisticsAccumulation(&local_ad8);
LAB_00104e7e:
  std::ifstream::~ifstream(local_918);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_element(kDefaultNumElement);
  sptk::EntropyCalculation::EntropyUnits entropy_unit(kDefaultEntropyUnit);
  bool output_frame_by_frame(kDefaultOutputFrameByFrameFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:o:fh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_element) ||
            num_element <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("entropy", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(
                          sptk::EntropyCalculation::EntropyUnits::kNumUnits) -
                      1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("entropy", error_message);
          return 1;
        }
        entropy_unit = static_cast<sptk::EntropyCalculation::EntropyUnits>(tmp);
        break;
      }
      case 'f': {
        output_frame_by_frame = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::StatisticsAccumulation statistics_accumulation(0, 1);
  sptk::StatisticsAccumulation::Buffer buffer;
  sptk::EntropyCalculation entropy_calculation(num_element, entropy_unit);
  if (!statistics_accumulation.IsValid() || !entropy_calculation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize EntropyCalculation";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  std::vector<double> probability(num_element);
  double entropy;

  while (sptk::ReadStream(false, 0, 0, num_element, &probability, &input_stream,
                          NULL)) {
    if (!entropy_calculation.Run(probability, &entropy)) {
      std::ostringstream error_message;
      error_message << "Failed to calculate entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }

    if (output_frame_by_frame) {
      if (!sptk::WriteStream(entropy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write entropy";
        sptk::PrintErrorMessage("entropy", error_message);
        return 1;
      }
    } else {
      if (!statistics_accumulation.Run(std::vector<double>{entropy}, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate statistics";
        sptk::PrintErrorMessage("entropy", error_message);
        return 1;
      }
    }
  }

  int num_data;
  if (!statistics_accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  if (!output_frame_by_frame && 0 < num_data) {
    std::vector<double> average_entropy(1);
    if (!statistics_accumulation.GetMean(buffer, &average_entropy)) {
      std::ostringstream error_message;
      error_message << "Failed to calculate entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, 1, average_entropy, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
  }

  return 0;
}